

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# GeneralizedMAAStarPlannerForDecPOMDPDiscrete.h
# Opt level: O1

void __thiscall
GeneralizedMAAStarPlannerForDecPOMDPDiscrete::SetCBGbounds
          (GeneralizedMAAStarPlannerForDecPOMDPDiscrete *this,
          shared_ptr<PartialPolicyPoolItemInterface> *ppi,
          shared_ptr<BayesianGameIdenticalPayoffSolver> *bgips)

{
  long lVar1;
  size_t sVar2;
  DecPOMDPDiscreteInterface *pDVar3;
  double discount;
  PJPDP_sharedPtr jpolPrevTs;
  long local_38;
  shared_count local_30;
  
  (*ppi->px->_vptr_PartialPolicyPoolItemInterface[2])(&local_38);
  lVar1 = *(long *)(local_38 + 8);
  sVar2 = (this->super_PlanningUnitDecPOMDPDiscrete).super_PlanningUnitMADPDiscrete.
          super_PlanningUnit._m_horizon;
  pDVar3 = (this->super_PlanningUnitDecPOMDPDiscrete)._m_DecPOMDP;
  discount = (double)(**(code **)(*(long *)((long)&pDVar3->field_0x0 +
                                           *(long *)(*(long *)pDVar3 + -0xb0)) + 0x70))
                               ((long)&pDVar3->field_0x0 + *(long *)(*(long *)pDVar3 + -0xb0));
  GeneralizedMAAStarPlanner::SetCBGbounds
            (&this->super_GeneralizedMAAStarPlanner,ppi,bgips,lVar1 == sVar2 - 1,discount);
  boost::detail::shared_count::~shared_count(&local_30);
  return;
}

Assistant:

void SetCBGbounds(const boost::shared_ptr<PartialPolicyPoolItemInterface> &ppi,
                          const boost::shared_ptr<BayesianGameIdenticalPayoffSolver> &bgips)
        {
            PJPDP_sharedPtr jpolPrevTs = ppi->GetJPol();//jpol^ts-1
            size_t ts = jpolPrevTs->GetDepth();     // = depth = ts(jpolPrevTs) + 1
            bool is_last_ts = (ts ==  GetHorizon() - 1);
            this->GeneralizedMAAStarPlanner::SetCBGbounds(ppi,bgips,is_last_ts,GetDiscount());
        }